

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void testing::internal::TuplePrefix<2ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&>,testing::Matcher<std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>const&>,testing::Matcher<std::optional<SDL_Rect>const&>,testing::Matcher<std::optional<SDL_Rect>const&>>,std::tuple<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&,std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>const&,std::optional<SDL_Rect>const&,std::optional<SDL_Rect>const&>>
               (tuple<testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
                *matchers,
               tuple<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&>
               *values,ostream *os)

{
  bool bVar1;
  __tuple_element_t<1UL,_tuple<Matcher<const_unique_ptr<SDL_Renderer,_function<void_(SDL_Renderer_*)>_>_&>,_Matcher<const_unique_ptr<SDL_Texture,_function<void_(SDL_Texture_*)>_>_&>,_Matcher<const_optional<SDL_Rect>_&>,_Matcher<const_optional<SDL_Rect>_&>_>_>
  *p_Var2;
  ostream *poVar3;
  MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&> *this;
  string local_208;
  undefined1 local_1d8 [8];
  StringMatchResultListener listener;
  unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_> *value;
  type matcher;
  ostream *os_local;
  tuple<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&>
  *values_local;
  tuple<testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
  *matchers_local;
  
  matcher.
  super_MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>.
  buffer_ = (Buffer)os;
  TuplePrefix<1ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&>,testing::Matcher<std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>const&>,testing::Matcher<std::optional<SDL_Rect>const&>,testing::Matcher<std::optional<SDL_Rect>const&>>,std::tuple<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&,std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>const&,std::optional<SDL_Rect>const&,std::optional<SDL_Rect>const&>>
            (matchers,values,os);
  p_Var2 = std::
           get<1ul,testing::Matcher<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&>,testing::Matcher<std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>const&>,testing::Matcher<std::optional<SDL_Rect>const&>,testing::Matcher<std::optional<SDL_Rect>const&>>
                     (matchers);
  Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>::Matcher
            ((Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&> *)
             &value,p_Var2);
  listener._400_8_ =
       std::
       get<1ul,std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&,std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>const&,std::optional<SDL_Rect>const&,std::optional<SDL_Rect>const&>
                 (values);
  StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_1d8);
  bVar1 = MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>::
          MatchAndExplain((MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>
                           *)&value,
                          (unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_> *)
                          listener._400_8_,(MatchResultListener *)local_1d8);
  if (!bVar1) {
    poVar3 = std::operator<<((ostream *)
                             matcher.
                             super_MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>
                             .buffer_.shared,"  Expected arg #");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
    std::operator<<(poVar3,": ");
    this = &std::
            get<1ul,testing::Matcher<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&>,testing::Matcher<std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>const&>,testing::Matcher<std::optional<SDL_Rect>const&>,testing::Matcher<std::optional<SDL_Rect>const&>>
                      (matchers)->
            super_MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>
    ;
    MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>::
    DescribeTo(this,(ostream *)
                    matcher.
                    super_MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>
                    .buffer_.shared);
    std::operator<<((ostream *)
                    matcher.
                    super_MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>
                    .buffer_.shared,"\n           Actual: ");
    UniversalPrint<std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>>
              ((unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_> *)listener._400_8_,
               (ostream *)
               matcher.
               super_MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>
               .buffer_.shared);
    StringMatchResultListener::str_abi_cxx11_(&local_208,(StringMatchResultListener *)local_1d8);
    PrintIfNotEmpty(&local_208,
                    (ostream *)
                    matcher.
                    super_MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>
                    .buffer_.shared);
    std::__cxx11::string::~string((string *)&local_208);
    std::operator<<((ostream *)
                    matcher.
                    super_MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>
                    .buffer_.shared,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_1d8);
  Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>::~Matcher
            ((Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&> *)
             &value);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename std::tuple_element<N - 1, MatcherTuple>::type matcher =
        std::get<N - 1>(matchers);
    typedef typename std::tuple_element<N - 1, ValueTuple>::type Value;
    const Value& value = std::get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      *os << "  Expected arg #" << N - 1 << ": ";
      std::get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }